

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeGetStackPos(AsyncifyBuilder *this)

{
  uintptr_t uVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  uintptr_t uVar5;
  uint uVar6;
  uint uVar7;
  Expression *pEVar8;
  Load *this_00;
  
  uVar6 = wasm::Type::getByteSize(&this->pointerType);
  uVar7 = wasm::Type::getByteSize(&this->pointerType);
  uVar5 = DAT_010b1928;
  uVar4 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  uVar1 = (this->pointerType).id;
  pEVar8 = (Expression *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x20,8);
  pEVar8->_id = GlobalGetId;
  *(undefined8 *)(pEVar8 + 1) = uVar4;
  pEVar8[1].type.id = uVar5;
  (pEVar8->type).id = uVar1;
  uVar1 = (this->pointerType).id;
  sVar2 = (this->asyncifyMemory).super_IString.str._M_len;
  pcVar3 = (this->asyncifyMemory).super_IString.str._M_str;
  this_00 = (Load *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x48,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
  this_00->isAtomic = false;
  this_00->bytes = (uint8_t)uVar6;
  this_00->signed_ = false;
  (this_00->offset).addr = 0;
  (this_00->align).addr = (ulong)uVar7;
  this_00->ptr = pEVar8;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = uVar1;
  (this_00->memory).super_IString.str._M_len = sVar2;
  (this_00->memory).super_IString.str._M_str = pcVar3;
  Load::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

Expression* makeGetStackPos() {
    return makeLoad(pointerType.getByteSize(),
                    false,
                    int(DataOffset::BStackPos),
                    pointerType.getByteSize(),
                    makeGlobalGet(ASYNCIFY_DATA, pointerType),
                    pointerType,
                    asyncifyMemory);
  }